

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O1

bool __thiscall Assimp::MD5::MD5Parser::SkipLine(MD5Parser *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)this->buffer;
  this->lineNumber = this->lineNumber + 1;
  while ((0xd < *pbVar1 || ((0x2401U >> (*pbVar1 & 0x1f) & 1) == 0))) {
    pbVar1 = pbVar1 + 1;
  }
  for (; (*pbVar1 == 0xd || (*pbVar1 == 10)); pbVar1 = pbVar1 + 1) {
  }
  this->buffer = (char *)pbVar1;
  return *pbVar1 != 0;
}

Assistant:

bool SkipLine( )
    {
        return SkipLine(buffer,(const char**)&buffer);
    }